

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

size_t __thiscall
adios2::core::engine::BP4Reader::UpdateBuffer
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  size_t in_RDX;
  char *in_RSI;
  string *in_RDI;
  BP4Deserializer *unaff_retaddr;
  size_t *in_stack_00000010;
  size_t *in_stack_00000018;
  size_t newIdxSize;
  size_t newMDSize;
  size_t fileSize;
  char *buf;
  size_t expectedMinFileSize;
  size_t newIdxSize_1;
  vector<char,_std::allocator<char>_> idxbuf;
  size_t maxIdxSize;
  size_t idxFileSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  vector<char,_std::allocator<char>_> *this_00;
  ulong *__n;
  allocator_type *in_stack_fffffffffffffe28;
  value_type vVar5;
  allocator_type *in_stack_fffffffffffffe30;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffe38;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffe40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffe48;
  undefined1 *in_stack_fffffffffffffe80;
  int rankSource;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffe88;
  undefined2 uVar6;
  BufferSTL *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  TransportMan *in_stack_fffffffffffffea0;
  allocator local_119;
  string local_118 [32];
  ulong local_f8;
  size_t local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  string *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  BufferSTL *in_stack_ffffffffffffff50;
  ulong local_90;
  char *local_88;
  allocator<char> local_79;
  undefined1 local_78 [24];
  long local_60;
  size_t local_58;
  undefined8 local_38;
  allocator_type local_30 [8];
  size_t in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe7;
  string *IdxFileName;
  
  local_38 = 0;
  IdxFileName = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xa1f4f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe40._M_current,(size_type)in_stack_fffffffffffffe38._M_current,
             (value_type *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xa1f521);
  if ((*(int *)((long)&in_RDI[6].field_2 + *(long *)(*(long *)(in_RDI + 6) + -0x20)) == 0) &&
     (local_58 = transportman::TransportMan::GetFileSize
                           ((TransportMan *)in_stack_fffffffffffffe90,
                            (size_t)in_stack_fffffffffffffe88._M_current),
     *(ulong *)((long)&in_RDI[0x37].field_2 + 8) < local_58)) {
    local_60 = local_58 - *(long *)((long)&in_RDI[0x37].field_2 + 8);
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe40._M_current,
               (size_type)in_stack_fffffffffffffe38._M_current,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_79);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xa1f627);
    transportman::TransportMan::ReadFile
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90
               ,(size_t)in_stack_fffffffffffffe88._M_current,(size_t)in_stack_fffffffffffffe80);
    uVar6 = (undefined2)((ulong)in_stack_fffffffffffffe88._M_current >> 0x30);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xa1f662);
    __n = &local_90;
    this_00 = (vector<char,_std::allocator<char>_> *)&local_88;
    MetadataCalculateMinFileSize
              (unaff_retaddr,IdxFileName,in_RSI,in_RDX,(bool)in_stack_ffffffffffffffe7,
               in_stack_ffffffffffffffd8,in_stack_00000010,in_stack_00000018);
    pcVar2 = (char *)std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)
                                (&in_RDI[10]._M_dataplus + *(long *)(*(long *)(in_RDI + 6) + -0x18))
                               );
    if (pcVar2 < local_88) {
      in_stack_fffffffffffffe90 =
           (BufferSTL *)(&in_RDI[8]._M_dataplus + *(long *)(*(long *)(in_RDI + 6) + -0x18));
      in_stack_fffffffffffffea0 = (TransportMan *)&stack0xffffffffffffff47;
      in_stack_fffffffffffffe98 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff48,
                 "re-allocating metadata index buffer, in call to BP4Reader::BeginStep/UpdateBuffer"
                 ,(allocator *)in_stack_fffffffffffffea0);
      adios2::format::BufferSTL::Resize
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    }
    adios2::format::BufferSTL::Reset
              (in_stack_fffffffffffffe90,SUB21((ushort)uVar6 >> 8,0),SUB21(uVar6,0));
    in_stack_fffffffffffffe80 = local_78;
    local_c8 = (char *)std::vector<char,_std::allocator<char>_>::begin(this_00);
    local_d8 = (char *)std::vector<char,_std::allocator<char>_>::begin(this_00);
    local_d0 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffe28,(difference_type)__n);
    local_e0 = (char *)std::vector<char,_std::allocator<char>_>::begin(this_00);
    in_stack_fffffffffffffe88 =
         std::
         copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                   (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_f0 = 0;
    local_e8 = in_stack_fffffffffffffe88._M_current;
    do {
      local_f0 = transportman::TransportMan::GetFileSize
                           ((TransportMan *)in_stack_fffffffffffffe90,
                            (size_t)in_stack_fffffffffffffe88._M_current);
      if (local_90 <= local_f0) break;
      bVar1 = SleepOrQuit((BP4Reader *)in_stack_fffffffffffffe48._M_current,
                          (TimePoint *)in_stack_fffffffffffffe40._M_current,
                          (Seconds *)in_stack_fffffffffffffe38._M_current);
    } while (bVar1);
    if (local_90 <= local_f0) {
      local_f8 = local_90 - *(long *)(in_RDI + 0x32);
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)
                         ((long)&in_RDI[0xc]._M_string_length +
                         *(long *)(*(long *)(in_RDI + 6) + -0x20)));
      if (sVar3 < local_f8) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_118,"allocating metadata buffer, in call to BP4Reader Open",&local_119);
        adios2::format::BufferSTL::Resize
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      adios2::format::BufferSTL::Reset
                (in_stack_fffffffffffffe90,
                 SUB81((ulong)in_stack_fffffffffffffe88._M_current >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffe88._M_current >> 0x30,0));
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa1fb4a);
      transportman::TransportMan::ReadFile
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (size_t)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88._M_current,
                 (size_t)in_stack_fffffffffffffe80);
      in_RDI[0x32].field_2._M_allocated_capacity = *(size_type *)(in_RDI + 0x32);
      *(ulong *)(in_RDI + 0x32) = local_90;
      *(char **)((long)&in_RDI[0x37].field_2 + 8) =
           local_88 + *(long *)((long)&in_RDI[0x37].field_2 + 8);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,0);
      *pvVar4 = (value_type)local_88;
      vVar5 = *(value_type *)(in_RDI + 0x32);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,1);
      *pvVar4 = vVar5;
      vVar5 = in_RDI[0x32].field_2._M_allocated_capacity;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,2);
      *pvVar4 = vVar5;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe30);
  }
  rankSource = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  helper::Comm::BroadcastVector<unsigned_long>
            ((Comm *)in_stack_fffffffffffffe90,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe88._M_current,rankSource);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,0);
  vVar5 = *pvVar4;
  if (vVar5 != 0) {
    if (*(int *)((long)&in_RDI[6].field_2 + *(long *)(*(long *)(in_RDI + 6) + -0x20)) != 0) {
      in_stack_fffffffffffffe30 = local_30;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe30,1);
      *(value_type *)(in_RDI + 0x32) = *pvVar4;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe30,2);
      in_RDI[0x32].field_2._M_allocated_capacity = *pvVar4;
      adios2::format::BufferSTL::Reset
                (in_stack_fffffffffffffe90,
                 SUB81((ulong)in_stack_fffffffffffffe88._M_current >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffe88._M_current >> 0x30,0));
      adios2::format::BufferSTL::Reset
                (in_stack_fffffffffffffe90,
                 SUB81((ulong)in_stack_fffffffffffffe88._M_current >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffe88._M_current >> 0x30,0));
    }
    helper::Comm::BroadcastVector<char>
              ((Comm *)in_stack_fffffffffffffe90,
               (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe88._M_current,
               rankSource);
    helper::Comm::BroadcastVector<char>
              ((Comm *)in_stack_fffffffffffffe90,
               (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe88._M_current,
               rankSource);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe30);
  return vVar5;
}

Assistant:

size_t BP4Reader::UpdateBuffer(const TimePoint &timeoutInstant, const Seconds &pollSeconds)
{
    std::vector<size_t> sizes(3, 0);
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        const size_t idxFileSize = m_MDIndexFileManager.GetFileSize(0);
        if (idxFileSize > m_MDIndexFileAlreadyReadSize)
        {
            const size_t maxIdxSize = idxFileSize - m_MDIndexFileAlreadyReadSize;
            std::vector<char> idxbuf(maxIdxSize);
            m_MDIndexFileManager.ReadFile(idxbuf.data(), maxIdxSize, m_MDIndexFileAlreadyReadSize);
            size_t newIdxSize;
            size_t expectedMinFileSize;
            char *buf = idxbuf.data();

            MetadataCalculateMinFileSize(m_BP4Deserializer, m_Name, buf, maxIdxSize,
                                         !m_IdxHeaderParsed, m_MDFileAlreadyReadSize, newIdxSize,
                                         expectedMinFileSize);

            // const uint64_t expectedMinFileSize = MetadataExpectedMinFileSize(
            //    m_BP4Deserializer, m_Name, !m_IdxHeaderParsed);

            if (m_BP4Deserializer.m_MetadataIndex.m_Buffer.size() < newIdxSize)
            {
                m_BP4Deserializer.m_MetadataIndex.Resize(
                    newIdxSize, "re-allocating metadata index buffer, in "
                                "call to BP4Reader::BeginStep/UpdateBuffer");
            }
            m_BP4Deserializer.m_MetadataIndex.Reset(true, false);
            std::copy(idxbuf.begin(), idxbuf.begin() + newIdxSize,
                      m_BP4Deserializer.m_MetadataIndex.m_Buffer.begin());

            /* Wait until as much metadata arrives in the file as much
             * is indicated by the existing index entries
             */

            size_t fileSize = 0;
            do
            {
                fileSize = m_MDFileManager.GetFileSize(0);
                if (fileSize >= expectedMinFileSize)
                {
                    break;
                }
            } while (SleepOrQuit(timeoutInstant, pollSeconds));

            if (fileSize >= expectedMinFileSize)
            {
                /* Read corresponding new metadata (throwing away the old)
                 * There may be unprocessed entries in the metadata if the index
                 * had less steps than the metadata file at the last read.
                 * Those steps are read again here, starting in the beginning of
                 * the buffer now.
                 */
                const size_t newMDSize = expectedMinFileSize - m_MDFileAlreadyReadSize;
                if (m_BP4Deserializer.m_Metadata.m_Buffer.size() < newMDSize)
                {
                    m_BP4Deserializer.m_Metadata.Resize(newMDSize,
                                                        "allocating metadata buffer, in call to "
                                                        "BP4Reader Open");
                }
                m_BP4Deserializer.m_Metadata.Reset(true, false);
                m_MDFileManager.ReadFile(m_BP4Deserializer.m_Metadata.m_Buffer.data(), newMDSize,
                                         m_MDFileAlreadyReadSize);

                m_MDFileAbsolutePos = m_MDFileAlreadyReadSize;
                m_MDFileAlreadyReadSize = expectedMinFileSize;

                m_MDIndexFileAlreadyReadSize += newIdxSize;

                sizes[0] = newIdxSize;
                sizes[1] = m_MDFileAlreadyReadSize;
                sizes[2] = m_MDFileAbsolutePos;
            }
        }
    }

    m_Comm.BroadcastVector(sizes, 0);
    size_t newIdxSize = sizes[0];

    if (newIdxSize > 0)
    {
        if (m_BP4Deserializer.m_RankMPI != 0)
        {
            m_MDFileAlreadyReadSize = sizes[1];
            m_MDFileAbsolutePos = sizes[2];
            m_BP4Deserializer.m_MetadataIndex.Reset(true, false);
            m_BP4Deserializer.m_Metadata.Reset(true, false);
            // we need this pointer in Metadata buffer on all processes
            // for parsing it correctly in ProcessMetadataForNewSteps()
        }

        // broadcast buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_Metadata.m_Buffer);

        // broadcast metadata index buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_MetadataIndex.m_Buffer);
    }
    return newIdxSize;
}